

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float *pfVar1;
  char *pcVar2;
  float fVar3;
  int *piVar4;
  pointer pOVar5;
  char cVar6;
  int iVar7;
  float fVar8;
  long lVar9;
  ulong uVar10;
  float fVar11;
  int i;
  long lVar12;
  __m128 t_2;
  __m128 t;
  allocator local_2dd;
  int baseLine;
  Extractor ex;
  Size label_size;
  vector<Object,_std::allocator<Object>_> objects;
  float norm_vals [3];
  float mean_vals [3];
  float local_270;
  int local_26c;
  undefined1 local_268 [8];
  undefined8 uStack_260;
  undefined8 local_258;
  double dStack_250;
  Mat local_248;
  Mat image;
  undefined4 local_1f0;
  int iStack_1ec;
  Allocator *local_1d8;
  Mat m;
  int local_190;
  int local_18c;
  uchar *local_188;
  Net yolov3;
  
  if (argc == 2) {
    pcVar2 = argv[1];
    std::__cxx11::string::string((string *)&yolov3,pcVar2,(allocator *)&image);
    cv::imread((string *)&m,(int)&yolov3);
    std::__cxx11::string::~string((string *)&yolov3);
    cVar6 = cv::Mat::empty();
    if (cVar6 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&yolov3);
      yolov3.opt.use_vulkan_compute = true;
      iVar7 = ncnn::Net::load_param(&yolov3,"mobilenetv2_yolov3.param");
      if ((iVar7 != 0) ||
         (iVar7 = ncnn::Net::load_model(&yolov3,"mobilenetv2_yolov3.bin"), iVar7 != 0)) {
        exit(-1);
      }
      ncnn::Mat::from_pixels_resize
                ((Mat *)&image,local_188,2,local_18c,local_190,0x160,0x160,(Allocator *)0x0);
      mean_vals[0] = 127.5;
      mean_vals[1] = 127.5;
      mean_vals[2] = 127.5;
      norm_vals[0] = 0.007843;
      norm_vals[1] = 0.007843;
      norm_vals[2] = 0.007843;
      ncnn::Mat::substract_mean_normalize((Mat *)&image,mean_vals,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"data",(Mat *)&image);
      local_248.cstep = 0;
      local_248.data = (void *)0x0;
      local_248.refcount._0_4_ = 0;
      local_248.refcount._4_4_ = 0;
      local_248.elemsize._0_4_ = 0;
      local_248.elemsize._4_4_ = 0;
      local_248.elempack = 0;
      local_248.allocator = (Allocator *)0x0;
      local_248.dims = 0;
      local_248.w = 0;
      local_248.h = 0;
      local_248.d = 0;
      local_248.c = 0;
      ncnn::Extractor::extract(&ex,"detection_out",&local_248,0);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
        _M_finish = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      for (lVar12 = 0; lVar12 < local_248.h; lVar12 = lVar12 + 1) {
        lVar9 = local_248.w * lVar12 *
                CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
        local_258 = (double)CONCAT44(*(float *)((long)local_248.data + lVar9 + 4),
                                     (int)*(float *)((long)local_248.data + lVar9));
        local_268._0_4_ = *(float *)((long)local_248.data + lVar9 + 8) * (float)local_18c;
        local_268._4_4_ = *(float *)((long)local_248.data + lVar9 + 0xc) * (float)local_190;
        uStack_260 = (double)CONCAT44(*(float *)((long)local_248.data + lVar9 + 0x14) *
                                      (float)local_190 - (float)local_268._4_4_,
                                      *(float *)((long)local_248.data + lVar9 + 0x10) *
                                      (float)local_18c - (float)local_268._0_4_);
        std::vector<Object,_std::allocator<Object>_>::push_back(&objects,(value_type *)local_268);
      }
      piVar4 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_248.allocator == (Allocator *)0x0) {
            free(local_248.data);
          }
          else {
            (*(local_248.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Extractor::~Extractor(&ex);
      piVar4 = (int *)CONCAT44(iStack_1ec,local_1f0);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_1d8 == (Allocator *)0x0) {
            free(_image);
          }
          else {
            (*local_1d8->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&yolov3);
      cv::Mat::clone();
      lVar12 = 0;
      for (uVar10 = 0;
          pOVar5 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                   super__Vector_impl_data._M_start, local_248.refcount = (int *)&image,
          uVar10 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl
                                 .super__Vector_impl_data._M_start) / 0x18); uVar10 = uVar10 + 1) {
        fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                SUB84((double)*(float *)((long)&(objects.
                                                 super__Vector_base<Object,_std::allocator<Object>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->prob +
                                        lVar12),0),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).x +
                                  lVar12),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).y +
                                  lVar12),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).width +
                                  lVar12),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).height
                                  + lVar12),
                (ulong)*(uint *)((long)&(objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->label + lVar12)
               );
        local_248.elemsize._0_4_ = 0;
        local_248.elemsize._4_4_ = 0;
        local_248.data = (void *)CONCAT44(local_248.data._4_4_,0x3010000);
        pfVar1 = (float *)((long)&(pOVar5->rect).x + lVar12);
        mean_vals[2] = (float)(int)ROUND(pfVar1[2]);
        mean_vals[1] = (float)(int)ROUND(pfVar1[1]);
        mean_vals[0] = (float)(int)ROUND(*pfVar1);
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&yolov3);
        yolov3._vptr_Net = (_func_int **)0x406fe00000000000;
        yolov3.opt.lightmode = false;
        yolov3.opt._1_3_ = 0;
        yolov3.opt.num_threads = 0;
        yolov3.opt.blob_allocator = (Allocator *)0x0;
        yolov3.opt.workspace_allocator = (Allocator *)0x0;
        cv::rectangle(&local_248,mean_vals,&yolov3,1,8,0);
        sprintf((char *)&yolov3,"%s %.1f%%",
                SUB84((double)(*(float *)((long)&pOVar5->prob + lVar12) * 100.0),0),
                _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                *(int *)(_ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                        + (long)*(int *)((long)&pOVar5->label + lVar12) * 4));
        baseLine = 0;
        std::__cxx11::string::string((string *)&local_248,(char *)&yolov3,(allocator *)&ex);
        cv::getTextSize((string *)&label_size,(int)&local_248,0.5,0,(int *)0x1);
        std::__cxx11::string::~string((string *)&local_248);
        fVar8 = (float)(int)*(float *)((long)&(pOVar5->rect).x + lVar12);
        fVar11 = (float)(int)((*(float *)((long)&(pOVar5->rect).y + lVar12) -
                              (float)label_size.height) - (float)baseLine);
        if ((int)fVar11 < 1) {
          fVar11 = 0.0;
        }
        fVar3 = (float)(iStack_1ec - label_size.width);
        if (label_size.width + (int)fVar8 <= iStack_1ec) {
          fVar3 = fVar8;
        }
        ex._vptr_Extractor._0_4_ = 0x3010000;
        norm_vals[1] = fVar11;
        norm_vals[0] = fVar3;
        norm_vals[2] = (float)label_size.width;
        ex.d = (ExtractorPrivate *)&image;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_248);
        local_248.data = (void *)0x406fe00000000000;
        local_248.refcount._0_4_ = 0;
        local_248.refcount._4_4_ = 0x406fe000;
        local_248.elemsize._0_4_ = 0;
        local_248.elemsize._4_4_ = 0x406fe000;
        local_248.elempack = 0;
        local_248._28_4_ = 0;
        cv::rectangle(&ex,norm_vals,&local_248,0xffffffffffffffff,8,0);
        ex._vptr_Extractor._0_4_ = 0x3010000;
        ex.d = (ExtractorPrivate *)&image;
        std::__cxx11::string::string((string *)&local_248,(char *)&yolov3,&local_2dd);
        local_26c = (int)fVar11 + label_size.height;
        local_270 = fVar3;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)local_268);
        local_258 = 0.0;
        dStack_250 = 0.0;
        local_268 = (undefined1  [8])0x0;
        uStack_260 = 0.0;
        cv::putText(0,&ex,&local_248,&local_270,0,(Matx<double,_4,_1> *)local_268,1,8,0);
        std::__cxx11::string::~string((string *)&local_248);
        lVar12 = lVar12 + 0x18;
      }
      std::__cxx11::string::string((string *)&yolov3,"image",(allocator *)&ex);
      local_248.elemsize._0_4_ = 0;
      local_248.elemsize._4_4_ = 0;
      local_248.data = (void *)CONCAT44(local_248.data._4_4_,0x1010000);
      cv::imshow((string *)&yolov3,(_InputArray *)&local_248);
      std::__cxx11::string::~string((string *)&yolov3);
      iVar7 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat(&image);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects.super__Vector_base<Object,_std::allocator<Object>_>);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar2);
      iVar7 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar7 = -1;
  }
  return iVar7;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_yolov3(m, objects);

    draw_objects(m, objects);

    return 0;
}